

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

cmLinkImplementationLibraries * __thiscall
cmGeneratorTarget::GetLinkImplementationLibrariesInternal
          (cmGeneratorTarget *this,string *config,cmGeneratorTarget *head)

{
  _Base_ptr p_Var1;
  bool bVar2;
  map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
  *this_00;
  mapped_type *impl;
  string CONFIG;
  cmGeneratorTarget *local_40;
  string local_38;
  
  local_40 = head;
  bVar2 = cmTarget::IsImported(this->Target);
  if (bVar2) {
    impl = (mapped_type *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&local_38,config);
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::HeadToLinkImplementationMap>_>_>
               ::operator[](&this->LinkImplMap,&local_38)->
               super_map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
    ;
    if (((this_00->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0) ||
       (p_Var1 = (this_00->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left,
       *(char *)((long)&p_Var1[3]._M_left + 2) != '\0')) {
      impl = std::
             map<const_cmGeneratorTarget_*,_cmOptionalLinkImplementation,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_cmOptionalLinkImplementation>_>_>
             ::operator[](this_00,&local_40);
      if (impl->LibrariesDone == false) {
        impl->LibrariesDone = true;
        ComputeLinkImplementationLibraries(this,config,impl,local_40);
      }
    }
    else {
      impl = (mapped_type *)&p_Var1[1]._M_parent;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return (cmLinkImplementationLibraries *)impl;
}

Assistant:

cmLinkImplementationLibraries const*
cmGeneratorTarget::GetLinkImplementationLibrariesInternal(
  const std::string& config, cmGeneratorTarget const* head) const
{
  // There is no link implementation for imported targets.
  if (this->IsImported()) {
    return nullptr;
  }

  // Populate the link implementation libraries for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  HeadToLinkImplementationMap& hm = this->LinkImplMap[CONFIG];

  // If the link implementation does not depend on the head target
  // then return the one we computed first.
  if (!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition) {
    return &hm.begin()->second;
  }

  cmOptionalLinkImplementation& impl = hm[head];
  if (!impl.LibrariesDone) {
    impl.LibrariesDone = true;
    this->ComputeLinkImplementationLibraries(config, impl, head);
  }
  return &impl;
}